

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O0

void __thiscall asmjit::ConstPool::reset(ConstPool *this,Zone *zone)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  size_t i;
  size_t dataSize;
  char *in_stack_000003a0;
  int in_stack_000003ac;
  char *in_stack_000003b0;
  ulong local_40;
  long local_38;
  
  *in_RDI = in_RSI;
  local_38 = 1;
  local_40 = 0;
  while( true ) {
    if (5 < local_40) {
      in_RDI[0x19] = 0;
      in_RDI[0x1a] = 0;
      in_RDI[0x1b] = 0;
      return;
    }
    in_RDI[local_40 * 3 + 1] = 0;
    (in_RDI + local_40 * 3 + 1)[1] = 0;
    if (in_RDI[local_40 * 3 + 2] != 0) break;
    in_RDI[local_40 * 3 + 3] = local_38;
    in_RDI[local_40 + 0x13] = 0;
    local_38 = local_38 << 1;
    local_40 = local_40 + 1;
  }
  DebugUtils::assertionFailed(in_stack_000003b0,in_stack_000003ac,in_stack_000003a0);
}

Assistant:

void ConstPool::reset(Zone* zone) noexcept {
  _zone = zone;

  size_t dataSize = 1;
  for (size_t i = 0; i < ASMJIT_ARRAY_SIZE(_tree); i++) {
    _tree[i].reset();
    _tree[i].setDataSize(dataSize);
    _gaps[i] = nullptr;
    dataSize <<= 1;
  }

  _gapPool = nullptr;
  _size = 0;
  _alignment = 0;
}